

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel_solve.cpp
# Opt level: O2

void __thiscall Clasp::mt::ParallelSolve::doStop(ParallelSolve *this)

{
  atomic<unsigned_int> *paVar1;
  int ec;
  char *fmt;
  
  if (1 < this->shared_->nextId) {
    reportProgress(this,*(this->shared_->ctx->solvers_).ebo_.buf,"joining with other threads");
    if (1 < (this->shared_->generator).ptr_) {
      LOCK();
      paVar1 = &this->shared_->control;
      (paVar1->super___atomic_base<unsigned_int>)._M_i =
           (paVar1->super___atomic_base<unsigned_int>)._M_i | 1;
      UNLOCK();
      SharedData::Generator::notify
                ((Generator *)((this->shared_->generator).ptr_ & 0xfffffffffffffffe),done);
      ParallelHandler::join(*this->thread_);
    }
    ec = joinThreads(this);
    SingleOwnerPtr<Clasp::mt::ParallelSolve::SharedData::Generator,_Clasp::DeleteObject>::reset
              (&this->shared_->generator,(Generator *)0x0);
    SingleOwnerPtr<Clasp::Distributor,_Clasp::DeleteObject>::reset
              (&this->shared_->ctx->distributor,(Distributor *)0x0);
    if (ec != 0) {
      fmt = Potassco::StringBuilder::c_str(&this->shared_->msg);
      Potassco::fail(ec,"virtual void Clasp::mt::ParallelSolve::doStop()",0x197,"err == 0",fmt,0);
    }
  }
  return;
}

Assistant:

void ParallelSolve::doStop() {
	if (shared_->nextId <= 1) { return; }
	reportProgress(*shared_->ctx->master(), "joining with other threads");
	if (shared_->generator.get()) {
		shared_->setControl(SharedData::terminate_flag);
		shared_->generator->notify(SharedData::Generator::done);
		thread_[masterId]->join();
	}
	int err = joinThreads();
	shared_->generator = 0;
	shared_->ctx->distributor.reset(0);
	POTASSCO_CHECK(err == 0, err, shared_->msg.c_str());
}